

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddError
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          char *error)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,error,&local_49);
  AddError(this,element_name,descriptor,location,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void DescriptorBuilder::AddError(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location, const char* error) {
  AddError(element_name, descriptor, location, std::string(error));
}